

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ArrayColumnCheckpointState::ArrayColumnCheckpointState
          (ArrayColumnCheckpointState *this,RowGroup *row_group,ColumnData *column_data,
          PartialBlockManager *partial_block_manager)

{
  undefined8 __p;
  undefined1 local_90 [120];
  
  (this->super_ColumnCheckpointState).row_group = row_group;
  (this->super_ColumnCheckpointState).column_data = column_data;
  (this->super_ColumnCheckpointState).new_tree.super_SegmentTree<duckdb::ColumnSegment,_false>.
  finished_loading._M_base._M_i = true;
  (this->super_ColumnCheckpointState).new_tree.super_SegmentTree<duckdb::ColumnSegment,_false>.nodes
  .
  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ColumnCheckpointState).new_tree.
           super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ColumnCheckpointState).new_tree.
           super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->super_ColumnCheckpointState).new_tree.super_SegmentTree<duckdb::ColumnSegment,_false>.
  node_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_ColumnCheckpointState).new_tree.
           super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base._M_mutex + 8
   ) = 0;
  *(undefined8 *)
   ((long)&(this->super_ColumnCheckpointState).new_tree.
           super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base._M_mutex +
   0x10) = 0;
  (this->super_ColumnCheckpointState).new_tree.super_SegmentTree<duckdb::ColumnSegment,_false>.
  node_lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->super_ColumnCheckpointState).new_tree.
           super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock.super___mutex_base._M_mutex.
           __data.__list + 8) = (__pthread_internal_list *)0x0;
  (this->super_ColumnCheckpointState).new_tree.super_SegmentTree<duckdb::ColumnSegment,_false>.
  _vptr_SegmentTree = (_func_int **)&PTR__SegmentTree_0279fc18;
  (this->super_ColumnCheckpointState).data_pointers.
  super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ColumnCheckpointState).data_pointers.
  super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ColumnCheckpointState).data_pointers.
  super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ColumnCheckpointState).global_stats.
  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  (this->super_ColumnCheckpointState).partial_block_manager = partial_block_manager;
  (this->super_ColumnCheckpointState)._vptr_ColumnCheckpointState =
       (_func_int **)&PTR__ArrayColumnCheckpointState_0279fe20;
  (this->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (ColumnCheckpointState *)0x0;
  (this->child_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (ColumnCheckpointState *)0x0;
  LogicalType::LogicalType((LogicalType *)(local_90 + 8),&column_data->type);
  ArrayStats::CreateEmpty((BaseStatistics *)(local_90 + 0x20),(LogicalType *)(local_90 + 8));
  BaseStatistics::ToUnique((BaseStatistics *)local_90);
  __p = local_90._0_8_;
  local_90._0_8_ =
       (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &(this->super_ColumnCheckpointState).global_stats,(pointer)__p);
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              local_90);
  BaseStatistics::~BaseStatistics((BaseStatistics *)(local_90 + 0x20));
  LogicalType::~LogicalType((LogicalType *)(local_90 + 8));
  return;
}

Assistant:

ArrayColumnCheckpointState(RowGroup &row_group, ColumnData &column_data, PartialBlockManager &partial_block_manager)
	    : ColumnCheckpointState(row_group, column_data, partial_block_manager) {
		global_stats = ArrayStats::CreateEmpty(column_data.type).ToUnique();
	}